

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O0

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::details::
read_and_send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,details *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,descriptor *fd)

{
  bool bVar1;
  pointer first;
  size_type __nbytes;
  ssize_t sVar2;
  descriptor local_498;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_488;
  undefined4 local_480;
  span<const_unsigned_char,__1L> local_470;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_460;
  undefined1 local_458 [8];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  eo;
  size_t num_read;
  value_type_conflict3 *data;
  array<unsigned_char,_1024UL> buffer;
  descriptor *fd_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  buffer._M_elems._1016_8_ = io._M_data;
  sender_local = sender;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  memset(&data,0,0x400);
  first = std::array<unsigned_char,_1024UL>::data((array<unsigned_char,_1024UL> *)&data);
  pstore::gsl::not_null<void_*>::not_null((not_null<void_*> *)&eo.has_error_,first);
  __nbytes = std::array<unsigned_char,_1024UL>::size((array<unsigned_char,_1024UL> *)&data);
  sVar2 = pstore::romfs::descriptor::read((descriptor *)io._M_data,eo._16_4_,(void *)0x1,__nbytes);
  if (sVar2 == 0) {
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>&,void>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                *)__return_storage_ptr__,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                *)&sender_local);
  }
  else {
    local_460 = sender_local;
    pstore::gsl::span<const_unsigned_char,_-1L>::span(&local_470,first,first + sVar2);
    send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                *)local_458,(http *)this,local_460,
               (descriptor<pstore::details::posix_descriptor_traits> *)&local_470,
               (span<const_unsigned_char,__1L> *)fd);
    bVar1 = pstore::error_or::operator_cast_to_bool((error_or *)local_458);
    if (bVar1) {
      local_488 = sender_local;
      pstore::romfs::descriptor::descriptor(&local_498,(descriptor *)io._M_data);
      read_and_send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (__return_storage_ptr__,this,local_488,
                 (descriptor<pstore::details::posix_descriptor_traits> *)&local_498,fd);
      pstore::romfs::descriptor::~descriptor(&local_498);
    }
    else {
      error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
      ::error_or(__return_storage_ptr__,
                 (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                  *)local_458);
    }
    local_480 = 1;
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                 *)local_458);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> read_and_send (Sender sender, IO io,
                                                pstore::romfs::descriptor fd) {
                std::array<std::uint8_t, 1024> buffer{{0}};
                auto * const data = buffer.data ();
                std::size_t const num_read =
                    fd.read (data, sizeof (decltype (buffer)::value_type), buffer.size ());
                if (num_read == 0) {
                    return pstore::error_or<IO>{io};
                }
                pstore::error_or<IO> const eo =
                    send (sender, io, gsl::span<std::uint8_t const> (data, data + num_read));
                if (!eo) {
                    return eo;
                }
                return read_and_send (sender, io, fd);
            }